

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

char * TadsServerManager::gen_rand_id(void *obj)

{
  char cVar1;
  char *pcVar2;
  int i;
  char *ret;
  uchar hval [32];
  uchar rbuf [128];
  long systime;
  tm *tblock;
  time_t timer;
  sha256_ctx s;
  size_t in_stack_00001278;
  uchar *in_stack_00001280;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int iVar3;
  uchar *in_stack_fffffffffffffed0;
  uchar local_128 [8];
  sha256_ctx *in_stack_fffffffffffffee0;
  unsigned_long in_stack_fffffffffffffee8;
  uchar *in_stack_fffffffffffffef0;
  time_t local_78;
  sha256_ctx local_70;
  
  sha256_begin(&local_70);
  local_78 = time((time_t *)0x0);
  localtime(&local_78);
  sha256_hash(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  os_get_sys_clock_ms();
  sha256_hash(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  sha256_hash(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  sha256_hash(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  os_gen_rand_bytes(in_stack_00001280,in_stack_00001278);
  sha256_hash(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  sha256_end(in_stack_fffffffffffffed0,
             (sha256_ctx *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  pcVar2 = lib_alloc_str((size_t)in_stack_fffffffffffffed0);
  for (iVar3 = 0; iVar3 < 0x20; iVar3 = iVar3 + 1) {
    cVar1 = nybble2hex(local_128[iVar3]);
    pcVar2[iVar3] = cVar1;
  }
  pcVar2[iVar3] = '\0';
  return pcVar2;
}

Assistant:

char *TadsServerManager::gen_rand_id(void *obj)
{
    /* set up a hashing buffer */
    sha256_ctx s;
    sha256_begin(&s);

    /* add the current date/time to the hash */
    os_time_t timer = os_time(0);
    struct tm *tblock = os_localtime(&timer);
    sha256_hash((unsigned char *)tblock, sizeof(*tblock), &s);

    /* add the system timer to the hash */
    long systime = os_get_sys_clock_ms();
    sha256_hash((unsigned char *)&systime, sizeof(systime), &s);

    /* add the object address to the hash */
    sha256_hash((unsigned char *)obj, sizeof(obj), &s);

    /* add the current stack location to the hash */
    sha256_hash((unsigned char *)&obj, sizeof(void *), &s);

    /* add some random bytes from the operating system */
    unsigned char rbuf[128];
    os_gen_rand_bytes(rbuf, sizeof(rbuf));
    sha256_hash(rbuf, sizeof(rbuf), &s);

    /* compute the hash */
    unsigned char hval[32];
    sha256_end(hval, &s);

    /* convert it to hex, but just keep the low nybbles, for 32 digits */
    char *ret = lib_alloc_str(32);
    int i;
    for (i = 0 ; i < 32 ; ++i)
        ret[i] = nybble2hex(hval[i]);

    /* null-terminate the string */
    ret[i] = '\0';

    /* return the allocated string */
    return ret;
}